

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

SmallLeafHeapBlockT<SmallAllocationBlockAttributes> * __thiscall
Memory::HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>::CreateHeapBlock
          (HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *this,
          Recycler *recycler)

{
  BOOL BVar1;
  SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *heapBlock;
  Recycler *recycler_local;
  HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *this_local;
  
  this_local = (HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *)
               GetUnusedHeapBlock(this);
  if ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)this_local ==
      (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    this_local = (HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *)0x0;
  }
  else {
    BVar1 = SmallHeapBlockT<SmallAllocationBlockAttributes>::ReassignPages
                      ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)this_local,recycler);
    if (BVar1 == 0) {
      FreeHeapBlock(this,(SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)this_local);
      this_local = (HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *)0x0;
    }
    else {
      HeapInfo::AppendNewHeapBlock<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>>
                ((this->super_HeapBucket).heapInfo,
                 (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)this_local,this);
      InterlockedIncrement<unsigned_int>(&(this->super_HeapBucket).newHeapBlockCount);
    }
  }
  return (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)this_local;
}

Assistant:

TBlockType *
HeapBucketT<TBlockType>::CreateHeapBlock(Recycler * recycler)
{
    FAULTINJECT_MEMORY_NOTHROW(_u("HeapBlock"), sizeof(TBlockType));

    // Add a new heap block
    TBlockType * heapBlock = GetUnusedHeapBlock();
    if (heapBlock == nullptr)
    {
        return nullptr;
    }

    if (!heapBlock->ReassignPages(recycler))
    {
        FreeHeapBlock(heapBlock);
        return nullptr;
    }

    // Add it to head of heap block list so we will keep track of the block
    this->heapInfo->AppendNewHeapBlock(heapBlock, this);
#if defined(RECYCLER_SLOW_CHECK_ENABLED) || ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
#if ENABLE_CONCURRENT_GC
    ::InterlockedIncrement(&this->newHeapBlockCount);
#else
    this->heapBlockCount++;
#endif
#endif
    return heapBlock;
}